

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest_lite.pb.cc
# Opt level: O0

uint8_t * __thiscall
proto2_unittest::NonPackedFixed32::_InternalSerialize
          (NonPackedFixed32 *this,uint8_t *target,EpsCopyOutputStream *stream)

{
  bool bVar1;
  int iVar2;
  uint8_t *target_00;
  RepeatedField<unsigned_int> *this_00;
  const_reference puVar3;
  void *data;
  int local_30;
  int n;
  int i;
  uint32_t cached_has_bits;
  NonPackedFixed32 *this_;
  EpsCopyOutputStream *stream_local;
  uint8_t *target_local;
  NonPackedFixed32 *this_local;
  
  local_30 = 0;
  iVar2 = _internal_repeated_fixed32_size(this);
  stream_local = (EpsCopyOutputStream *)target;
  for (; local_30 < iVar2; local_30 = local_30 + 1) {
    target_00 = google::protobuf::io::EpsCopyOutputStream::EnsureSpace
                          (stream,(uint8_t *)stream_local);
    this_00 = _internal_repeated_fixed32(this);
    puVar3 = google::protobuf::RepeatedField<unsigned_int>::Get(this_00,local_30);
    stream_local = (EpsCopyOutputStream *)
                   google::protobuf::internal::WireFormatLite::WriteFixed32ToArray
                             (0x800,*puVar3,target_00);
  }
  bVar1 = google::protobuf::internal::InternalMetadata::have_unknown_fields
                    (&(this->super_MessageLite)._internal_metadata_);
  if (bVar1) {
    google::protobuf::internal::InternalMetadata::unknown_fields<std::__cxx11::string>
              (&(this->super_MessageLite)._internal_metadata_,
               google::protobuf::internal::GetEmptyString_abi_cxx11_);
    data = (void *)std::__cxx11::string::data();
    google::protobuf::internal::InternalMetadata::unknown_fields<std::__cxx11::string>
              (&(this->super_MessageLite)._internal_metadata_,
               google::protobuf::internal::GetEmptyString_abi_cxx11_);
    iVar2 = std::__cxx11::string::size();
    stream_local = (EpsCopyOutputStream *)
                   google::protobuf::io::EpsCopyOutputStream::WriteRaw
                             (stream,data,iVar2,(uint8_t *)stream_local);
  }
  return (uint8_t *)stream_local;
}

Assistant:

::uint8_t* PROTOBUF_NONNULL NonPackedFixed32::_InternalSerialize(
    ::uint8_t* PROTOBUF_NONNULL target,
    ::google::protobuf::io::EpsCopyOutputStream* PROTOBUF_NONNULL stream) const {
  const NonPackedFixed32& this_ = *this;
#endif  // PROTOBUF_CUSTOM_VTABLE
  // @@protoc_insertion_point(serialize_to_array_start:proto2_unittest.NonPackedFixed32)
  ::uint32_t cached_has_bits = 0;
  (void)cached_has_bits;

  // repeated fixed32 repeated_fixed32 = 2048;
  for (int i = 0, n = this_._internal_repeated_fixed32_size(); i < n; ++i) {
    target = stream->EnsureSpace(target);
    target = ::_pbi::WireFormatLite::WriteFixed32ToArray(
        2048, this_._internal_repeated_fixed32().Get(i), target);
  }

  if (ABSL_PREDICT_FALSE(this_._internal_metadata_.have_unknown_fields())) {
    target = stream->WriteRaw(
        this_._internal_metadata_.unknown_fields<std::string>(::google::protobuf::internal::GetEmptyString).data(),
        static_cast<int>(this_._internal_metadata_.unknown_fields<std::string>(::google::protobuf::internal::GetEmptyString).size()), target);
  }
  // @@protoc_insertion_point(serialize_to_array_end:proto2_unittest.NonPackedFixed32)
  return target;
}